

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeString::releaseBuffer(UnicodeString *this,int32_t newLength)

{
  ushort uVar1;
  int iVar2;
  char16_t *pcVar3;
  char16_t *pcVar4;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (-2 < newLength && (uVar1 & 0x10) != 0) {
    iVar2 = 0x1b;
    if ((uVar1 & 2) == 0) {
      iVar2 = (this->fUnion).fFields.fCapacity;
    }
    if (newLength == -1) {
      if ((uVar1 & 2) == 0) {
        pcVar3 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar3 = (this->fUnion).fStackFields.fBuffer;
      }
      pcVar4 = pcVar3;
      if (0 < iVar2) {
        do {
          if (*pcVar4 == L'\0') break;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < pcVar3 + iVar2);
      }
      newLength = (int)((ulong)((long)pcVar4 - (long)pcVar3) >> 1);
    }
    else if (iVar2 < newLength) {
      newLength = iVar2;
    }
    if (newLength < 0x400) {
      (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(newLength << 5) | uVar1 & 0x1f;
    }
    else {
      (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
      (this->fUnion).fFields.fLength = newLength;
    }
    *(byte *)&this->fUnion = *(byte *)&this->fUnion & 0xef;
  }
  return;
}

Assistant:

void
UnicodeString::releaseBuffer(int32_t newLength) {
  if(fUnion.fFields.fLengthAndFlags&kOpenGetBuffer && newLength>=-1) {
    // set the new fLength
    int32_t capacity=getCapacity();
    if(newLength==-1) {
      // the new length is the string length, capped by fCapacity
      const UChar *array=getArrayStart(), *p=array, *limit=array+capacity;
      while(p<limit && *p!=0) {
        ++p;
      }
      newLength=(int32_t)(p-array);
    } else if(newLength>capacity) {
      newLength=capacity;
    }
    setLength(newLength);
    fUnion.fFields.fLengthAndFlags&=~kOpenGetBuffer;
  }
}